

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_P256_validate_private_key(uint8_t *private_key)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t *os;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  os = &local_28;
  uVar1 = *(ulong *)(private_key + 0x18);
  local_28 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(private_key + 0x10);
  local_20 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(private_key + 8);
  local_18 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)private_key;
  local_10 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar2 = bn_is_lt_order_and_gt_zero_mask4(os);
  return uVar2 == 0xffffffffffffffff;
}

Assistant:

bool Hacl_P256_validate_private_key(uint8_t *private_key)
{
  uint64_t bn_sk[4U] = { 0U };
  bn_from_bytes_be4(bn_sk, private_key);
  uint64_t res = bn_is_lt_order_and_gt_zero_mask4(bn_sk);
  return res == 0xFFFFFFFFFFFFFFFFULL;
}